

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFabFactory.cpp
# Opt level: O3

unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_> __thiscall
amrex::makeEBFabFactory
          (amrex *this,Geometry *a_geom,BoxArray *a_ba,DistributionMapping *a_dm,
          Vector<int,_std::allocator<int>_> *a_ngrow,EBSupport a_support)

{
  int iVar1;
  IndexSpace *pIVar2;
  undefined4 extraout_var;
  undefined8 *puVar3;
  undefined1 local_51;
  BoxArray *local_50;
  Vector<int,_std::allocator<int>_> *local_48;
  DistributionMapping *local_40;
  EBSupport local_34;
  
  local_50 = a_ba;
  local_48 = a_ngrow;
  local_40 = a_dm;
  pIVar2 = EB2::IndexSpace::top();
  iVar1 = (*pIVar2->_vptr_IndexSpace[2])(pIVar2,a_geom);
  puVar3 = (undefined8 *)operator_new(0xf0);
  *puVar3 = &PTR__EBFArrayBoxFactory_00714d80;
  *(EBSupport *)(puVar3 + 1) = a_support;
  local_34 = a_support;
  memcpy(puVar3 + 2,a_geom,200);
  puVar3[0x1b] = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<amrex::EBDataCollection,std::allocator<amrex::EBDataCollection>,amrex::EB2::Level_const&,amrex::Geometry_const&,amrex::BoxArray_const&,amrex::DistributionMapping_const&,amrex::Vector<int,std::allocator<int>>const&,amrex::EBSupport&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar3 + 0x1c),
             (EBDataCollection **)(puVar3 + 0x1b),(allocator<amrex::EBDataCollection> *)&local_51,
             (Level *)CONCAT44(extraout_var,iVar1),a_geom,local_50,local_40,local_48,&local_34);
  puVar3[0x1d] = (Level *)CONCAT44(extraout_var,iVar1);
  *(undefined8 **)this = puVar3;
  return (__uniq_ptr_data<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>,_true,_true>
          )(__uniq_ptr_data<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<EBFArrayBoxFactory>
makeEBFabFactory (const Geometry& a_geom,
                  const BoxArray& a_ba,
                  const DistributionMapping& a_dm,
                  const Vector<int>& a_ngrow, EBSupport a_support)
{
    const EB2::IndexSpace& index_space = EB2::IndexSpace::top();
    const EB2::Level& eb_level = index_space.getLevel(a_geom);
    return std::make_unique<EBFArrayBoxFactory>(eb_level, a_geom, a_ba, a_dm, a_ngrow, a_support);
}